

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  CURLcode CVar2;
  FTP *pFVar3;
  uint uVar4;
  char *pcVar5;
  
  pFVar3 = (FTP *)(*Curl_ccalloc)(0x20,1);
  (data->req).p.ftp = pFVar3;
  if (pFVar3 == (FTP *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar5 = (data->state).up.path + 1;
    pFVar3->path = pcVar5;
    pcVar5 = strstr(pcVar5,";type=");
    if (pcVar5 == (char *)0x0) {
      pcVar5 = strstr((conn->host).rawalloc,";type=");
    }
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
      cVar1 = Curl_raw_toupper(pcVar5[6]);
      uVar4 = *(uint *)&(data->state).field_0x6d0;
      if (cVar1 == 'D') {
        uVar4 = uVar4 | 0x10000;
      }
      else if (cVar1 == 'A') {
        uVar4 = uVar4 | 0x8000;
      }
      else {
        uVar4 = uVar4 & 0xffff7fff;
      }
      *(uint *)&(data->state).field_0x6d0 = uVar4;
    }
    pFVar3->transfer = PPTRANSFER_BODY;
    pFVar3->downloadsize = 0;
    (conn->proto).ftpc.known_filesize = -1;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  char *type;
  struct FTP *ftp;

  data->req.p.ftp = ftp = calloc(sizeof(struct FTP), 1);
  if(!ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->state.list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = PPTRANSFER_BODY;
  ftp->downloadsize = 0;
  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}